

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O2

float __thiscall gmath::IDW::get(IDW *this,uint x,uint y)

{
  float nominator;
  float denominator;
  float local_10;
  float local_c;
  
  if (this->root != (IDWNode *)0x0) {
    local_10 = 0.0;
    local_c = 0.0;
    IDWNode::get(this->root,x,y,&local_10,&local_c);
    if ((local_c != 0.0) || (NAN(local_c))) {
      return local_10 / local_c;
    }
  }
  return 0.0;
}

Assistant:

float IDW::get(unsigned int x, unsigned int y) const
{
  if (root != 0)
  {
    float nominator=0;
    float denominator=0;

    root->get(x, y, nominator, denominator);

    if (denominator != 0)
    {
      return nominator/denominator;
    }
  }

  return 0;
}